

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O1

ParseResults __thiscall
bubbleJson::BubbleJson::ParseLiteral
          (BubbleJson *this,BubbleValue *bubbleValue,char *expectJson,ValueTypes expectResult)

{
  char *pcVar1;
  BubbleContext *pBVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  
  pBVar2 = this->context;
  if (*pBVar2->json != *expectJson) {
    __assert_fail("*this->context->json == expectChar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                  ,0x38,"void bubbleJson::BubbleJson::Expect(const char)");
  }
  pcVar4 = pBVar2->json + 1;
  pBVar2->json = pcVar4;
  uVar5 = 0;
  do {
    lVar3 = uVar5 + 1;
    if (expectJson[lVar3] == '\0') {
      pBVar2->json = pcVar4 + (uVar5 & 0xffffffff);
      bubbleValue->type = expectResult;
      return ParseResult_Ok;
    }
    pcVar1 = pcVar4 + uVar5;
    uVar5 = uVar5 + 1;
  } while (*pcVar1 == expectJson[lVar3]);
  return ParseResult_InvalidValue;
}

Assistant:

ParseResults BubbleJson::ParseLiteral(BubbleValue *bubbleValue, const char *expectJson, ValueTypes expectResult)
{
    Expect(expectJson[0]);

    const char *json = this->context->json;
    int i;
    //因为Expect里面json会自加1，所以json比expectJson快进一个字符
    for (i = 0; expectJson[i + 1]; i++)
    {
        if (json[i] != expectJson[i + 1])
            return ParseResult_InvalidValue;
    }
    this->context->json += i;
    bubbleValue->type = expectResult;
    return ParseResult_Ok;
}